

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

void math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
     eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*,unsigned_int*>
               (uint *r,uint *a,uint *b,unsigned_fast_type n,uint *t)

{
  uint *puVar1;
  uint *b_00;
  uint *r_00;
  uint *puVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  unsigned_fast_type i_4;
  ulong uVar6;
  char cVar7;
  long lVar8;
  unsigned_fast_type uVar9;
  bool bVar10;
  uint *b_01;
  ulong uVar11;
  ulong n_00;
  
  if (n < 0x31) {
    eval_multiply_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*>(r,a,b,n);
    return;
  }
  n_00 = n >> 1;
  puVar1 = a + n_00;
  b_01 = b + n_00;
  b_00 = t + n_00;
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*,unsigned_int*>
            (r + n,puVar1,b_01,n_00,t);
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*,unsigned_int*>
            (r,a,b,n_00,t);
  lVar8 = 0;
  do {
    *(undefined4 *)((long)t + lVar8) = *(undefined4 *)((long)r + lVar8);
    lVar8 = lVar8 + 4;
  } while (n * 8 - lVar8 != 0);
  r_00 = t + n;
  uVar9 = 0;
  uVar6 = 0;
  do {
    uVar11 = (ulong)r_00[uVar9] + r[n_00 + uVar9] + uVar6;
    uVar6 = uVar11 >> 0x20;
    r[n_00 + uVar9] = (uint)uVar11;
    uVar9 = uVar9 + 1;
  } while (n != uVar9);
  if (uVar11 >> 0x20 != 0) {
    uVar11 = 1;
    do {
      puVar2 = r + n_00 + n + (uVar11 - 1);
      uVar3 = *puVar2;
      uVar5 = (uint)uVar6;
      *puVar2 = *puVar2 + uVar5;
      if (n_00 <= uVar11) break;
      uVar6 = (ulong)CARRY4(uVar3,uVar5);
      uVar11 = uVar11 + 1;
    } while (CARRY4(uVar3,uVar5));
  }
  uVar9 = 0;
  uVar6 = 0;
  do {
    uVar11 = (ulong)t[uVar9] + r[n_00 + uVar9] + uVar6;
    uVar6 = uVar11 >> 0x20;
    r[n_00 + uVar9] = (uint)uVar11;
    uVar9 = uVar9 + 1;
  } while (n != uVar9);
  if (uVar11 >> 0x20 != 0) {
    uVar11 = 1;
    do {
      puVar2 = r + n_00 + n + (uVar11 - 1);
      uVar3 = *puVar2;
      uVar5 = (uint)uVar6;
      *puVar2 = *puVar2 + uVar5;
      if (n_00 <= uVar11) break;
      uVar6 = (ulong)CARRY4(uVar3,uVar5);
      uVar11 = uVar11 + 1;
    } while (CARRY4(uVar3,uVar5));
  }
  lVar8 = 0;
  do {
    if (-lVar8 == n_00 * 4) {
      cVar7 = '\0';
      goto LAB_0011d896;
    }
    uVar3 = *(uint *)((long)a + lVar8 + n_00 * 4 + -4);
    uVar5 = *(uint *)((long)a + lVar8 + n_00 * 8 + -4);
    lVar8 = lVar8 + -4;
  } while (uVar5 == uVar3);
  if (uVar3 < uVar5) {
    uVar6 = 0;
    bVar10 = false;
    do {
      uVar11 = ((ulong)puVar1[uVar6] - (ulong)bVar10) - (ulong)a[uVar6];
      t[uVar6] = (uint)uVar11;
      bVar10 = uVar11 >> 0x20 != 0;
      uVar6 = uVar6 + 1;
    } while (n_00 != uVar6);
    cVar7 = '\x01';
  }
  else {
    uVar6 = 0;
    bVar10 = false;
    do {
      uVar11 = ((ulong)a[uVar6] - (ulong)bVar10) - (ulong)puVar1[uVar6];
      t[uVar6] = (uint)uVar11;
      bVar10 = uVar11 >> 0x20 != 0;
      uVar6 = uVar6 + 1;
    } while (n_00 != uVar6);
    cVar7 = -1;
  }
LAB_0011d896:
  lVar8 = 0;
  do {
    if (-lVar8 == n_00 * 4) {
      cVar4 = '\0';
      goto LAB_0011d930;
    }
    uVar3 = *(uint *)((long)b + lVar8 + n_00 * 8 + -4);
    uVar5 = *(uint *)((long)b + lVar8 + n_00 * 4 + -4);
    lVar8 = lVar8 + -4;
  } while (uVar5 == uVar3);
  if (uVar3 < uVar5) {
    uVar6 = 0;
    bVar10 = false;
    do {
      uVar11 = ((ulong)b[uVar6] - (ulong)bVar10) - (ulong)b_01[uVar6];
      b_00[uVar6] = (uint)uVar11;
      bVar10 = uVar11 >> 0x20 != 0;
      uVar6 = uVar6 + 1;
    } while (n_00 != uVar6);
    cVar4 = '\x01';
  }
  else {
    uVar6 = 0;
    bVar10 = false;
    do {
      uVar11 = ((ulong)b_01[uVar6] - (ulong)bVar10) - (ulong)b[uVar6];
      b_00[uVar6] = (uint)uVar11;
      bVar10 = uVar11 >> 0x20 != 0;
      uVar6 = uVar6 + 1;
    } while (n_00 != uVar6);
    cVar4 = -1;
  }
LAB_0011d930:
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*,unsigned_int*>
            (r_00,t,b_00,n_00,t + n * 2);
  if ((char)(cVar4 * cVar7) == '\x01') {
    uVar9 = 0;
    uVar6 = 0;
    do {
      uVar11 = (ulong)r_00[uVar9] + r[n_00 + uVar9] + uVar6;
      uVar6 = uVar11 >> 0x20;
      r[n_00 + uVar9] = (uint)uVar11;
      uVar9 = uVar9 + 1;
    } while (n != uVar9);
    if (uVar11 >> 0x20 != 0) {
      uVar11 = 1;
      do {
        puVar1 = r + n_00 + n + (uVar11 - 1);
        uVar3 = *puVar1;
        uVar5 = (uint)uVar6;
        *puVar1 = *puVar1 + uVar5;
        if (n_00 <= uVar11) {
          return;
        }
        uVar6 = (ulong)CARRY4(uVar3,uVar5);
        uVar11 = uVar11 + 1;
      } while (CARRY4(uVar3,uVar5));
    }
  }
  else if ((char)(cVar4 * cVar7) == -1) {
    uVar9 = 0;
    bVar10 = false;
    do {
      uVar6 = ((ulong)r[n_00 + uVar9] - (ulong)bVar10) - (ulong)r_00[uVar9];
      r[n_00 + uVar9] = (uint)uVar6;
      uVar6 = uVar6 >> 0x20;
      bVar10 = uVar6 != 0;
      uVar9 = uVar9 + 1;
    } while (n != uVar9);
    if (uVar6 != 0) {
      uVar6 = 1;
      do {
        uVar3 = r[n_00 + n + (uVar6 - 1)];
        r[n_00 + n + (uVar6 - 1)] = (uint)((ulong)uVar3 - 1);
        if (n_00 <= uVar6) {
          return;
        }
        uVar6 = uVar6 + 1;
      } while ((ulong)uVar3 - 1 >> 0x20 != 0);
    }
  }
  return;
}

Assistant:

static constexpr
    auto eval_multiply_kara_n_by_n_to_2n(      ResultIterator     r, // NOLINT(misc-no-recursion)
                                         const InputIteratorLeft  a,
                                         const InputIteratorRight b,
                                         const unsigned_fast_type n,
                                               InputIteratorTemp  t) -> void
    {
      if(n <= static_cast<unsigned_fast_type>(UINT32_C(48)))
      {
        static_cast<void>(t);

        eval_multiply_n_by_n_to_2n(r, a, b, n);
      }
      else
      {
        static_assert
        (
             (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
          && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits)
          && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorTemp>::value_type>::digits),
          "Error: Internals require same widths for left-right-result limb_types at the moment"
        );

        using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

        using result_difference_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::difference_type;
        using left_difference_type   = typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::difference_type;
        using right_difference_type  = typename detail::iterator_detail::iterator_traits<InputIteratorRight>::difference_type;
        using temp_difference_type   = typename detail::iterator_detail::iterator_traits<InputIteratorTemp>::difference_type;

        // Based on "Algorithm 1.3 KaratsubaMultiply", Sect. 1.3.2, page 5
        // of R.P. Brent and P. Zimmermann, "Modern Computer Arithmetic",
        // Cambridge University Press (2011).

        // The Karatsuba multipliation computes the product of u*v as:
        // [b^N + b^(N/2)] a1*b1 + [b^(N/2)](a1 - a0)(b0 - b1) + [b^(N/2) + 1] a0*b0

        // Here we visualize u and v in two components 0,1 corresponding
        // to the high and low order parts, respectively.

        // Step 1
        // Calculate a1*b1 and store it in the upper part of r.
        // Calculate a0*b0 and store it in the lower part of r.
        // copy r to t0.

        // Step 2
        // Add a1*b1 (which is t2) to the middle two-quarters of r (which is r1)
        // Add a0*b0 (which is t0) to the middle two-quarters of r (which is r1)

        // Step 3
        // Calculate |a1-a0| in t0 and note the sign (i.e., the borrow flag)

        // Step 4
        // Calculate |b0-b1| in t1 and note the sign (i.e., the borrow flag)

        // Step 5
        // Call kara mul to calculate |a1-a0|*|b0-b1| in (t2),
        // while using temporary storage in t4 along the way.

        // Step 6
        // Check the borrow signs. If a1-a0 and b0-b1 have the same signs,
        // then add |a1-a0|*|b0-b1| to r1, otherwise subtract it from r1.

        const auto nh = static_cast<unsigned_fast_type>(n / 2U);

        const InputIteratorLeft   a0 = detail::advance_and_point(a, static_cast<left_difference_type>(0));
        const InputIteratorLeft   a1 = detail::advance_and_point(a, static_cast<left_difference_type>(nh));

        const InputIteratorRight  b0 = detail::advance_and_point(b, static_cast<right_difference_type>(0));
        const InputIteratorRight  b1 = detail::advance_and_point(b, static_cast<right_difference_type>(nh));

              ResultIterator      r0 = detail::advance_and_point(r, static_cast<result_difference_type>(0));
              ResultIterator      r1 = detail::advance_and_point(r, static_cast<result_difference_type>(nh));
              ResultIterator      r2 = detail::advance_and_point(r, static_cast<result_difference_type>(n));
              ResultIterator      r3 = detail::advance_and_point(r, static_cast<result_difference_type>(static_cast<result_difference_type>(n) + static_cast<result_difference_type>(nh)));

              InputIteratorTemp   t0 = detail::advance_and_point(t, static_cast<temp_difference_type>(0));
              InputIteratorTemp   t1 = detail::advance_and_point(t, static_cast<temp_difference_type>(nh));
              InputIteratorTemp   t2 = detail::advance_and_point(t, static_cast<temp_difference_type>(n));
              InputIteratorTemp   t4 = detail::advance_and_point(t, static_cast<temp_difference_type>(static_cast<result_difference_type>(n) + static_cast<result_difference_type>(n)));

        // Step 1
        //   a1*b1 -> r2
        //   a0*b0 -> r0
        //   r -> t0
        eval_multiply_kara_n_by_n_to_2n(r2, a1, b1, nh, t0);
        eval_multiply_kara_n_by_n_to_2n(r0, a0, b0, nh, t0);
        detail::copy_unsafe(r0, detail::advance_and_point(r0, static_cast<result_difference_type>(static_cast<result_difference_type>(n) * static_cast<result_difference_type>(2U))), t0);

        // Step 2
        //   r1 += a1*b1
        //   r1 += a0*b0
        auto carry = static_cast<local_limb_type>(eval_add_n(r1, r1, t2, n));
        eval_multiply_kara_propagate_carry(r3, nh, carry);
        carry = static_cast<local_limb_type>(eval_add_n(r1, r1, t0, n));
        eval_multiply_kara_propagate_carry(r3, nh, carry);

        // Step 3
        //   |a1-a0| -> t0
        const auto cmp_result_a1a0 = compare_ranges(a1, a0, nh);

        if(cmp_result_a1a0 == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          static_cast<void>(eval_subtract_n(t0, a1, a0, nh));
        }
        else if(cmp_result_a1a0 == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          static_cast<void>(eval_subtract_n(t0, a0, a1, nh));
        }

        // Step 4
        //   |b0-b1| -> t1
        const auto cmp_result_b0b1 = compare_ranges(b0, b1, nh);

        if(cmp_result_b0b1 == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          static_cast<void>(eval_subtract_n(t1, b0, b1, nh));
        }
        else if(cmp_result_b0b1 == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          static_cast<void>(eval_subtract_n(t1, b1, b0, nh));
        }

        // Step 5
        //   |a1-a0|*|b0-b1| -> t2
        eval_multiply_kara_n_by_n_to_2n(t2, t0, t1, nh, t4);

        // Step 6
        //   either r1 += |a1-a0|*|b0-b1|
        //   or     r1 -= |a1-a0|*|b0-b1|
        if(static_cast<std::int_fast8_t>(cmp_result_a1a0 * cmp_result_b0b1) == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          carry = eval_add_n(r1, r1, t2, n);

          eval_multiply_kara_propagate_carry(r3, nh, carry);
        }
        else if(static_cast<std::int_fast8_t>(cmp_result_a1a0 * cmp_result_b0b1) == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          const auto has_borrow = eval_subtract_n(r1, r1, t2, n);

          eval_multiply_kara_propagate_borrow(r3, nh, has_borrow);
        }
      }
    }